

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O3

void __thiscall S2CellUnion::Encode(S2CellUnion *this,Encoder *encoder)

{
  pointer pSVar1;
  S2CellId *cell_id;
  pointer this_00;
  
  Encoder::Ensure(encoder,(long)(this->cell_ids_).
                                super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                                super__Vector_impl_data._M_finish +
                          (9 - (long)(this->cell_ids_).
                                     super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl
                                     .super__Vector_impl_data._M_start));
  Encoder::put8(encoder,'\x01');
  Encoder::put64(encoder,(long)(this->cell_ids_).
                               super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(this->cell_ids_).
                               super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3);
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pSVar1; this_00 = this_00 + 1) {
    S2CellId::Encode(this_00,encoder);
  }
  return;
}

Assistant:

void S2CellUnion::Encode(Encoder* const encoder) const {
  // Unsigned char for version number, and N+1 uint64's for N cell_ids
  // (1 for vector length, N for the ids).
  encoder->Ensure(sizeof(unsigned char) +
                  sizeof(uint64) * (1 + cell_ids_.size()));

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  encoder->put64(uint64{cell_ids_.size()});
  for (const S2CellId& cell_id : cell_ids_) {
    cell_id.Encode(encoder);
  }
}